

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool __thiscall
slang::ast::anon_unknown_39::lookupUpward
          (anon_unknown_39 *this,
          span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
          nameParts,NameComponents *name,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
          LookupResult *result)

{
  InstanceSymbol *this_00;
  LookupResult *this_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  bool bVar1;
  Symbol *pSVar2;
  DefinitionSymbol *pDVar3;
  Scope *this_02;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined4 in_register_0000008c;
  uint32_t uVar5;
  Symbol *firstMatch;
  anon_class_48_6_55dedb8f tryMatch;
  bitmask<slang::ast::LookupFlags> local_84;
  ASTContext *local_80;
  Symbol *local_78;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> local_70;
  anon_class_48_6_55dedb8f local_60;
  
  _Var4 = nameParts._M_extent._M_extent_value;
  local_70._M_extent._M_extent_value = (size_t)nameParts._M_ptr;
  this_01 = (LookupResult *)CONCAT44(in_register_0000008c,flags.m_bits);
  local_60.nameParts = &local_70;
  local_60.flags = &local_84;
  local_84.m_bits = (underlying_type)context;
  local_60.firstMatch = &local_78;
  local_78 = (Symbol *)0x0;
  local_60.result = (LookupResult *)CONCAT44(in_register_0000008c,flags.m_bits);
  this_02 = (Scope *)(name->text)._M_len;
  uVar5 = 0;
  local_80 = (ASTContext *)name;
  local_70._M_ptr = (pointer)this;
  local_60.name = (NameComponents *)_Var4._M_extent_value;
  local_60.context = (ASTContext *)name;
  do {
    pSVar2 = Scope::find(this_02,*(string_view *)_Var4._M_extent_value);
    if ((((pSVar2 != (Symbol *)0x0) && (bVar1 = Symbol::isValue(pSVar2), !bVar1)) &&
        (bVar1 = Symbol::isType(pSVar2), !bVar1)) &&
       ((bVar1 = Symbol::isScope(pSVar2), bVar1 || (pSVar2->kind == Instance)))) {
      bVar1 = lookupUpward::anon_class_48_6_55dedb8f::operator()(&local_60,pSVar2);
      if (!bVar1) goto LAB_002f2442;
      if (this_01->found == (Symbol *)0x0) goto LAB_002f2391;
LAB_002f2446:
      this_01->upwardCount = uVar5;
      goto LAB_002f244a;
    }
LAB_002f2391:
    pSVar2 = this_02->thisSym;
    if (pSVar2->kind == InstanceBody) {
      this_00 = (InstanceSymbol *)pSVar2[1].originatingSyntax;
      this_02 = (this_00->super_InstanceSymbolBase).super_Symbol.parentScope;
      pDVar3 = InstanceSymbol::getDefinition(this_00);
      __x._M_len = (pDVar3->super_Symbol).name._M_len;
      __x._M_str = (pDVar3->super_Symbol).name._M_str;
      bVar1 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                   _Var4._M_extent_value);
      if (bVar1) {
        bVar1 = lookupUpward::anon_class_48_6_55dedb8f::operator()(&local_60,(Symbol *)this_00);
        if (!bVar1) goto LAB_002f2442;
        if (this_01->found != (Symbol *)0x0) goto LAB_002f2446;
      }
    }
    else {
      this_02 = Symbol::getHierarchicalParent(pSVar2);
    }
    uVar5 = uVar5 + 1;
  } while (this_02 != (Scope *)0x0);
  LookupResult::clear(this_01);
  if (local_78 == (Symbol *)0x0) {
LAB_002f244a:
    bVar1 = true;
  }
  else {
    this_01->found = local_78;
    nameParts_00._M_extent._M_extent_value = local_70._M_extent._M_extent_value;
    nameParts_00._M_ptr = local_70._M_ptr;
    lookupDownward(nameParts_00,*(NameComponents *)_Var4._M_extent_value,local_80,local_84,this_01);
LAB_002f2442:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lookupUpward(std::span<const NamePlusLoc> nameParts, const NameComponents& name,
                  const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    // Upward lookups can match either a scope name, or a module definition name (on any of the
    // instances). Imports are not considered.
    const Symbol* firstMatch = nullptr;
    auto tryMatch = [&](const Symbol& symbol) {
        // Keep track of the first match we find; if it turns out we can't
        // resolve all of the name parts we'll move on and try elsewhere,
        // but at the end if we couldn't find a full match we'll use this to
        // provide a better error.
        if (!firstMatch)
            firstMatch = &symbol;

        result.clear();
        result.found = &symbol;
        return lookupDownward(nameParts, name, context, flags, result);
    };

    uint32_t upwardCount = 0;
    const Scope* scope = context.scope;
    do {
        // Search for a scope or instance target within our current scope.
        auto symbol = scope->find(name.text);
        if (symbol && !symbol->isValue() && !symbol->isType() &&
            (symbol->isScope() || symbol->kind == SymbolKind::Instance)) {
            if (!tryMatch(*symbol))
                return false;

            if (result.found) {
                result.upwardCount = upwardCount;
                return true;
            }
        }

        // Advance to the next scope, skipping to the parent instance when
        // we hit an instance body instead of going on to the compilation unit.
        symbol = &scope->asSymbol();
        if (symbol->kind != SymbolKind::InstanceBody) {
            scope = symbol->getHierarchicalParent();
        }
        else {
            auto inst = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(inst);

            // If the instance's definition name matches our target name,
            // try to match from the current instance.
            scope = inst->getParentScope();
            if (inst->getDefinition().name == name.text) {
                if (!tryMatch(*inst))
                    return false;

                if (result.found) {
                    result.upwardCount = upwardCount;
                    return true;
                }
            }
        }

        upwardCount++;
    } while (scope);

    result.clear();
    if (firstMatch) {
        // If we did find a match at some point, repeat that
        // lookup to provide a real error message.
        result.found = firstMatch;
        lookupDownward(nameParts, name, context, flags, result);
        return false;
    }
    return true;
}